

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

GLFWcursor * glfwCreateStandardCursor(int shape)

{
  int iVar1;
  _GLFWcursor *cursor;
  char *format;
  
  if (_glfwInitialized == '\0') {
    iVar1 = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (0xfffffff9 < shape - 0x36007U) {
      cursor = (_GLFWcursor *)calloc(1,0x10);
      cursor->next = _glfw.cursorListHead;
      _glfw.cursorListHead = cursor;
      iVar1 = _glfwPlatformCreateStandardCursor(cursor,shape);
      if (iVar1 != 0) {
        return (GLFWcursor *)cursor;
      }
      glfwDestroyCursor((GLFWcursor *)cursor);
      return (GLFWcursor *)0x0;
    }
    format = "Invalid standard cursor";
    iVar1 = 0x10003;
  }
  _glfwInputError(iVar1,format);
  return (GLFWcursor *)0x0;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateStandardCursor(int shape)
{
    _GLFWcursor* cursor;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (shape != GLFW_ARROW_CURSOR &&
        shape != GLFW_IBEAM_CURSOR &&
        shape != GLFW_CROSSHAIR_CURSOR &&
        shape != GLFW_HAND_CURSOR &&
        shape != GLFW_HRESIZE_CURSOR &&
        shape != GLFW_VRESIZE_CURSOR)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid standard cursor");
        return NULL;
    }

    cursor = calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfwPlatformCreateStandardCursor(cursor, shape))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}